

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void __thiscall ImGuiTextBuffer::append(ImGuiTextBuffer *this,char *str,char *str_end)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  int new_size;
  int iVar4;
  int iVar5;
  
  if (str_end == (char *)0x0) {
    sVar2 = strlen(str);
    iVar5 = (int)sVar2;
  }
  else {
    iVar5 = (int)str_end - (int)str;
  }
  iVar4 = (this->Buf).Size;
  iVar1 = (this->Buf).Capacity;
  iVar4 = iVar4 + (uint)(iVar4 == 0);
  new_size = iVar4 + iVar5;
  if (iVar1 <= new_size) {
    iVar1 = iVar1 * 2;
    if (iVar1 < new_size) {
      iVar1 = new_size;
    }
    ImVector<char>::reserve(&this->Buf,iVar1);
  }
  ImVector<char>::resize(&this->Buf,new_size);
  pcVar3 = ImVector<char>::operator[](&this->Buf,iVar4 + -1);
  memcpy(pcVar3,str,(long)iVar5);
  pcVar3 = ImVector<char>::operator[](&this->Buf,iVar4 + iVar5 + -1);
  *pcVar3 = '\0';
  return;
}

Assistant:

void ImGuiTextBuffer::append(const char* str, const char* str_end)
{
    int len = str_end ? (int)(str_end - str) : (int)strlen(str);

    // Add zero-terminator the first time
    const int write_off = (Buf.Size != 0) ? Buf.Size : 1;
    const int needed_sz = write_off + len;
    if (write_off + len >= Buf.Capacity)
    {
        int new_capacity = Buf.Capacity * 2;
        Buf.reserve(needed_sz > new_capacity ? needed_sz : new_capacity);
    }

    Buf.resize(needed_sz);
    memcpy(&Buf[write_off - 1], str, (size_t)len);
    Buf[write_off - 1 + len] = 0;
}